

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

int log_define(char *name,log_policy policy)

{
  log_aspect_id aspect_id_00;
  int iVar1;
  log_impl impl_00;
  log_aspect aspect_00;
  log_aspect_interface ctor;
  log_policy in_RSI;
  log_aspect_interface aspect_iface;
  log_aspect aspect;
  log_aspect_id aspect_id;
  log_impl impl;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint local_4;
  
  impl_00 = log_singleton_get(in_stack_ffffffffffffffd0);
  aspect_id_00 = log_policy_aspect_id(in_RSI);
  aspect_00 = log_impl_aspect(impl_00,aspect_id_00);
  if (aspect_00 == (log_aspect)0x0) {
    ctor = log_impl_aspect_interface(LOG_ASPECT_FORMAT);
    aspect_00 = log_aspect_create((log_impl)CONCAT44(aspect_id_00,in_stack_ffffffffffffffd8),
                                  (log_aspect_interface)aspect_00,ctor);
    if (aspect_00 == (log_aspect)0x0) {
      return 1;
    }
    log_impl_define(impl_00,aspect_00,aspect_id_00);
  }
  iVar1 = log_aspect_attach((log_aspect)CONCAT44(aspect_id_00,in_stack_ffffffffffffffd8),
                            (log_policy)aspect_00);
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

int log_define(const char *name, log_policy policy)
{
	log_impl impl = log_singleton_get(name);

	enum log_aspect_id aspect_id = log_policy_aspect_id(policy);

	log_aspect aspect = log_impl_aspect(impl, aspect_id);

	if (aspect == NULL)
	{
		log_aspect_interface aspect_iface = log_impl_aspect_interface(aspect_id);

		/* TODO: review aspect constructor */

		aspect = log_aspect_create(impl, aspect_iface, NULL);

		if (aspect == NULL)
		{
			return 1;
		}

		log_impl_define(impl, aspect, aspect_id);
	}

	if (log_aspect_attach(aspect, policy) != 0)
	{
		return 1;
	}

	return 0;
}